

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant1.c
# Opt level: O2

void quantize_ord_dither(j_decompress_ptr cinfo,JSAMPARRAY input_buf,JSAMPARRAY output_buf,
                        int num_rows)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  jpeg_color_quantizer *pjVar4;
  JSAMPROW pJVar5;
  long lVar6;
  _func_void_j_decompress_ptr *p_Var7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  byte *pbVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  
  pjVar4 = cinfo->cquantize;
  uVar1 = cinfo->out_color_components;
  uVar10 = 0;
  uVar14 = 0;
  if (0 < (int)uVar1) {
    uVar14 = (ulong)uVar1;
  }
  uVar2 = cinfo->output_width;
  uVar8 = (ulong)(uint)num_rows;
  if (num_rows < 1) {
    uVar8 = uVar10;
  }
  for (; uVar10 != uVar8; uVar10 = uVar10 + 1) {
    jzero_far(output_buf[uVar10],(ulong)uVar2);
    iVar3 = *(int *)((long)&pjVar4[2].color_quantize + 4);
    for (uVar9 = 0; uVar9 != uVar14; uVar9 = uVar9 + 1) {
      pbVar11 = input_buf[uVar10] + uVar9;
      pJVar5 = output_buf[uVar10];
      lVar6 = *(long *)(pjVar4[1].finish_pass + uVar9 * 8);
      p_Var7 = (&pjVar4[2].finish_pass)[uVar9];
      uVar13 = 0;
      for (lVar12 = 0; uVar2 != (uint)lVar12; lVar12 = lVar12 + 1) {
        pJVar5[lVar12] =
             pJVar5[lVar12] +
             *(char *)(lVar6 + (long)*(int *)(p_Var7 + uVar13 * 4 + (long)iVar3 * 0x40) +
                               (ulong)*pbVar11);
        pbVar11 = pbVar11 + (int)uVar1;
        uVar13 = (ulong)((int)uVar13 + 1U & 0xf);
      }
    }
    *(uint *)((long)&pjVar4[2].color_quantize + 4) = iVar3 + 1U & 0xf;
  }
  return;
}

Assistant:

METHODDEF(void)
quantize_ord_dither(j_decompress_ptr cinfo, JSAMPARRAY input_buf,
                    JSAMPARRAY output_buf, int num_rows)
/* General case, with ordered dithering */
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr)cinfo->cquantize;
  register JSAMPROW input_ptr;
  register JSAMPROW output_ptr;
  JSAMPROW colorindex_ci;
  int *dither;                  /* points to active row of dither matrix */
  int row_index, col_index;     /* current indexes into dither matrix */
  int nc = cinfo->out_color_components;
  int ci;
  int row;
  JDIMENSION col;
  JDIMENSION width = cinfo->output_width;

  for (row = 0; row < num_rows; row++) {
    /* Initialize output values to 0 so can process components separately */
    jzero_far((void *)output_buf[row], (size_t)(width * sizeof(JSAMPLE)));
    row_index = cquantize->row_index;
    for (ci = 0; ci < nc; ci++) {
      input_ptr = input_buf[row] + ci;
      output_ptr = output_buf[row];
      colorindex_ci = cquantize->colorindex[ci];
      dither = cquantize->odither[ci][row_index];
      col_index = 0;

      for (col = width; col > 0; col--) {
        /* Form pixel value + dither, range-limit to 0..MAXJSAMPLE,
         * select output value, accumulate into output code for this pixel.
         * Range-limiting need not be done explicitly, as we have extended
         * the colorindex table to produce the right answers for out-of-range
         * inputs.  The maximum dither is +- MAXJSAMPLE; this sets the
         * required amount of padding.
         */
        *output_ptr +=
          colorindex_ci[*input_ptr + dither[col_index]];
        input_ptr += nc;
        output_ptr++;
        col_index = (col_index + 1) & ODITHER_MASK;
      }
    }
    /* Advance row index for next row */
    row_index = (row_index + 1) & ODITHER_MASK;
    cquantize->row_index = row_index;
  }
}